

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isTrilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  CmpResultSet CVar11;
  CmpResultSet CVar12;
  CmpResultSet CVar13;
  CmpResultSet CVar14;
  CmpResultSet CVar15;
  CmpResultSet CVar16;
  uint uVar17;
  uint uVar18;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  int i_1;
  byte bVar23;
  float *pfVar24;
  byte bVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Vec4 refVal1;
  Vec4 refVal0;
  byte local_130 [3];
  bool local_12d;
  byte local_12c [4];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108 [20];
  float local_b8 [4];
  undefined1 local_a8 [16];
  Vec2 *local_98;
  undefined8 uStack_90;
  Vec2 *local_88;
  undefined8 uStack_80;
  int local_78;
  undefined1 auStack_74 [12];
  float local_68;
  float local_58 [10];
  
  uStack_80 = local_88;
  local_88 = yBounds0;
  uStack_90 = local_98;
  local_98 = xBounds0;
  local_78 = prec->pcfBits;
  local_68 = result;
  local_128._0_4_ = cmpReference;
  CVar11 = execCompare(compareMode,depths0->m_data[0],cmpReference,prec->referenceBits,
                       isFixedPointDepth);
  local_118._0_4_ = (undefined4)CONCAT62(extraout_var,CVar11);
  CVar11 = execCompare(compareMode,depths0->m_data[1],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  CVar12 = execCompare(compareMode,depths0->m_data[2],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  CVar13 = execCompare(compareMode,depths0->m_data[3],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  CVar14 = execCompare(compareMode,depths1->m_data[0],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  local_a8._0_4_ = (int)CONCAT62(extraout_var_00,CVar14);
  CVar14 = execCompare(compareMode,depths1->m_data[1],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  CVar15 = execCompare(compareMode,depths1->m_data[2],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  CVar16 = execCompare(compareMode,depths1->m_data[3],(float)local_128._0_4_,prec->referenceBits,
                       isFixedPointDepth);
  if (local_78 < 1) {
    local_128._0_12_ = ZEXT812(0x3f800000);
    local_128._12_4_ = 0;
    if ((((((local_118._0_4_ & 1) == 0) && (((ushort)CVar11 & 1) == 0)) &&
         (((ushort)CVar12 & 1) == 0)) &&
        ((((ushort)CVar13 & 1) == 0 && ((local_a8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
         ))) && ((((ushort)CVar14 & 1) == 0 && (((ushort)CVar15 & 1) == 0)))) {
      if (((ushort)CVar16 & 1) == 0) {
        local_128 = ZEXT816(0);
      }
      else {
        local_128._0_12_ = ZEXT812(0x3f800000);
        local_128._12_4_ = 0;
      }
    }
    uVar18 = (uint)(ushort)CVar11 | local_118._0_4_;
    local_118 = ZEXT816(0);
    if (((((uint)(ushort)CVar15 | (uint)(ushort)CVar14 | local_a8._0_4_ |
          ((ushort)CVar13 | (ushort)CVar12) | uVar18) >> 8 & 1) == 0) &&
       (((ushort)CVar16 >> 8 & 1) == 0)) {
      local_118._0_12_ = ZEXT812(0x3f800000);
      local_118._12_4_ = 0;
    }
    fVar32 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    bVar25 = -((float)local_118._0_4_ - fVar32 <= local_68 &&
              local_68 <= (float)local_128._0_4_ + fVar32);
  }
  else {
    uVar17 = local_118._0_4_ & 1;
    uVar10 = local_a8._0_4_ & 1;
    uVar19 = (ushort)CVar16 >> 1 & 0x80 |
             (ushort)CVar15 >> 2 & 0x40 |
             (ushort)CVar14 >> 3 & 0x20 |
             (uint)local_a8._0_4_ >> 4 & 0x10 |
             (ushort)CVar13 >> 5 & 8 |
             (ushort)CVar12 >> 6 & 4 | (ushort)CVar11 >> 7 & 2 | (uint)local_118._0_4_ >> 8 & 1;
    local_128._0_4_ = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
    fVar27 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    fVar32 = local_98->m_data[0];
    fVar1 = *(float *)((long)local_98 + 4);
    fVar2 = local_88->m_data[0];
    fVar3 = *(float *)((long)local_88 + 4);
    fVar28 = 1.0 - fVar2;
    fVar29 = 1.0 - fVar3;
    fVar4 = xBounds1->m_data[0];
    fVar5 = xBounds1->m_data[1];
    fVar6 = yBounds1->m_data[0];
    fVar30 = 1.0 - fVar6;
    fVar7 = yBounds1->m_data[1];
    fVar33 = 1.0 - fVar7;
    fVar8 = fBounds->m_data[0];
    fVar9 = fBounds->m_data[1];
    uVar18 = 0;
    bVar25 = true;
    do {
      if ((((((ushort)CVar16 & 1) << 7 |
            ((ushort)CVar15 & 1) << 6 |
            ((ushort)CVar14 & 1) << 5 |
            uVar10 << 4 |
            uVar17 + ((ushort)CVar11 & 1) * 2 + ((ushort)CVar12 & 1) * 4 + ((ushort)CVar13 & 1) * 8)
           ^ uVar19) & uVar18 ^ uVar19) == 0xff) {
        bVar23 = (byte)uVar18;
        local_12c[0] = bVar23 & 1;
        local_130[0] = bVar23 >> 4 & 1;
        local_130[1] = bVar23 >> 5 & 1;
        local_130[2] = bVar23 >> 6 & 1;
        local_12d = 0x7f < uVar18;
        local_12c[1] = bVar23 >> 1 & 1;
        local_12c[2] = bVar23 >> 2 & 1;
        local_12c[3] = bVar23 >> 3 & 1;
        lVar20 = 0;
        do {
          local_108[lVar20] = 1.0;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 4);
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        local_58[3] = 0.0;
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        lVar20 = 0;
        pfVar21 = local_108;
        pfVar22 = local_58;
        do {
          pfVar24 = pfVar21;
          if (local_12c[lVar20] == 0) {
            pfVar24 = pfVar22;
          }
          local_b8[lVar20] = *pfVar24;
          lVar20 = lVar20 + 1;
          pfVar22 = pfVar22 + 1;
          pfVar21 = pfVar21 + 1;
        } while (lVar20 != 4);
        lVar20 = 0;
        do {
          local_58[lVar20] = 1.0;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 4);
        local_58[4] = 0.0;
        local_58[5] = 0.0;
        local_58[6] = 0.0;
        local_58[7] = 0.0;
        local_108[0] = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 0.0;
        local_108[3] = 0.0;
        lVar20 = 0;
        pfVar21 = local_58;
        pfVar22 = local_58 + 4;
        do {
          pfVar24 = pfVar21;
          if (local_130[lVar20] == 0) {
            pfVar24 = pfVar22;
          }
          local_108[lVar20] = *pfVar24;
          lVar20 = lVar20 + 1;
          pfVar22 = pfVar22 + 1;
          pfVar21 = pfVar21 + 1;
        } while (lVar20 != 4);
        fVar34 = (1.0 - fVar32) * local_b8[0];
        fVar37 = (1.0 - fVar32) * local_b8[2];
        fVar42 = fVar32 * local_b8[3] * fVar2 +
                 fVar37 * fVar2 + fVar34 * fVar28 + fVar28 * fVar32 * local_b8[1];
        local_b8[0] = local_b8[0] * (1.0 - fVar1);
        local_b8[2] = local_b8[2] * (1.0 - fVar1);
        fVar31 = local_b8[3] * fVar1 * fVar2 +
                 local_b8[2] * fVar2 + local_b8[0] * fVar28 + fVar28 * local_b8[1] * fVar1;
        fVar39 = fVar32 * local_b8[3] * fVar3 +
                 fVar37 * fVar3 + fVar34 * fVar29 + fVar32 * local_b8[1] * fVar29;
        fVar37 = local_b8[3] * fVar1 * fVar3 +
                 local_b8[2] * fVar3 + local_b8[0] * fVar29 + local_b8[1] * fVar1 * fVar29;
        fVar34 = (float)(~-(uint)(fVar39 <= fVar37) & (uint)fVar37 |
                        -(uint)(fVar39 <= fVar37) & (uint)fVar39);
        uVar26 = -(uint)(fVar31 <= fVar34);
        fVar34 = (float)(uVar26 & (uint)fVar31 | ~uVar26 & (uint)fVar34);
        uVar26 = -(uint)(fVar42 <= fVar34);
        fVar38 = (float)(uVar26 & (uint)fVar42 | ~uVar26 & (uint)fVar34);
        fVar34 = (1.0 - fVar4) * local_108[0];
        fVar43 = (1.0 - fVar4) * local_108[2];
        fVar41 = fVar4 * local_108[3] * fVar6 +
                 fVar43 * fVar6 + fVar34 * fVar30 + fVar30 * fVar4 * local_108[1];
        local_108[0] = local_108[0] * (1.0 - fVar5);
        local_108[2] = local_108[2] * (1.0 - fVar5);
        fVar35 = local_108[3] * fVar5 * fVar6 +
                 local_108[2] * fVar6 + local_108[0] * fVar30 + fVar30 * local_108[1] * fVar5;
        fVar40 = fVar4 * local_108[3] * fVar7 +
                 fVar43 * fVar7 + fVar34 * fVar33 + fVar4 * local_108[1] * fVar33;
        fVar36 = local_108[3] * fVar5 * fVar7 +
                 local_108[2] * fVar7 + local_108[0] * fVar33 + local_108[1] * fVar5 * fVar33;
        fVar34 = (float)(~-(uint)(fVar40 <= fVar36) & (uint)fVar36 |
                        -(uint)(fVar40 <= fVar36) & (uint)fVar40);
        uVar26 = -(uint)(fVar35 <= fVar34);
        fVar34 = (float)(uVar26 & (uint)fVar35 | ~uVar26 & (uint)fVar34);
        uVar26 = -(uint)(fVar41 <= fVar34);
        fVar34 = (float)(uVar26 & (uint)fVar41 | ~uVar26 & (uint)fVar34);
        fVar43 = fVar38 * (1.0 - fVar8) + fVar8 * fVar34;
        fVar34 = fVar38 * (1.0 - fVar9) + fVar34 * fVar9;
        uVar26 = -(uint)(fVar43 <= fVar34);
        if (((float)(~uVar26 & (uint)fVar34 | (uint)fVar43 & uVar26) -
             (fVar27 + (float)local_128._0_4_) <= local_68) &&
           (fVar34 = (float)(~-(uint)(fVar37 <= fVar39) & (uint)fVar37 |
                            (uint)fVar39 & -(uint)(fVar37 <= fVar39)),
           uVar26 = -(uint)(fVar34 <= fVar31),
           fVar34 = (float)(uVar26 & (uint)fVar31 | ~uVar26 & (uint)fVar34),
           uVar26 = -(uint)(fVar34 <= fVar42),
           fVar31 = (float)(uVar26 & (uint)fVar42 | ~uVar26 & (uint)fVar34),
           fVar34 = (float)(~-(uint)(fVar36 <= fVar40) & (uint)fVar36 |
                           (uint)fVar40 & -(uint)(fVar36 <= fVar40)),
           uVar26 = -(uint)(fVar34 <= fVar35),
           fVar34 = (float)(uVar26 & (uint)fVar35 | ~uVar26 & (uint)fVar34),
           uVar26 = -(uint)(fVar34 <= fVar41),
           fVar34 = (float)(uVar26 & (uint)fVar41 | ~uVar26 & (uint)fVar34),
           fVar37 = fVar31 * (1.0 - fVar8) + fVar8 * fVar34,
           fVar34 = fVar31 * (1.0 - fVar9) + fVar34 * fVar9, uVar26 = -(uint)(fVar34 <= fVar37),
           local_68 <=
           (float)(~uVar26 & (uint)fVar34 | (uint)fVar37 & uVar26) + fVar27 + (float)local_128._0_4_
           )) break;
      }
      bVar25 = uVar18 < 0xff;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x100);
  }
  return (bool)(bVar25 & 1);
}

Assistant:

static bool isTrilinearCompareValid (const Sampler::CompareMode	compareMode,
									 const TexComparePrecision&	prec,
									 const Vec4&				depths0,
									 const Vec4&				depths1,
									 const Vec2&				xBounds0,
									 const Vec2&				yBounds0,
									 const Vec2&				xBounds1,
									 const Vec2&				yBounds1,
									 const Vec2&				fBounds,
									 const float				cmpReference,
									 const float				result,
									 const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isTrilinearPCFCompareValid(compareMode, prec, depths0, depths1, xBounds0, yBounds0, xBounds1, yBounds1, fBounds, cmpReference, result, isFixedPointDepth);
	else
		return isTrilinearAnyCompareValid(compareMode, prec, depths0, depths1, cmpReference, result, isFixedPointDepth);
}